

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

void N_VAddConst_MultiFab(N_Vector x,Real b,N_Vector z)

{
  FabArrayBase *this;
  int iVar1;
  MultiFab **ppMVar2;
  N_Vector in_RSI;
  N_Vector in_RDI;
  undefined8 in_XMM0_Qa;
  MultiFab *unaff_retaddr;
  sunindextype nghost;
  sunindextype ncomp;
  MultiFab *mf_z;
  MultiFab *mf_x;
  Real in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  
  ppMVar2 = amrex::sundials::getMFptr(in_RDI);
  this = (FabArrayBase *)*ppMVar2;
  amrex::sundials::getMFptr(in_RSI);
  iVar1 = amrex::FabArrayBase::nComp(this);
  uVar3 = 0;
  amrex::MultiFab::Copy
            (unaff_retaddr,(MultiFab *)in_RDI,(int)((ulong)in_XMM0_Qa >> 0x20),(int)in_XMM0_Qa,
             (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  amrex::MultiFab::plus((MultiFab *)CONCAT44(iVar1,uVar3),in_stack_ffffffffffffffc8,0);
  return;
}

Assistant:

void N_VAddConst_MultiFab(N_Vector x, amrex::Real b, N_Vector z)
{
    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_z = amrex::sundials::getMFptr(z);

    sunindextype ncomp = mf_x->nComp();
    //sunindextype nghost = mf_x->nGrow();
    sunindextype nghost = 0;  // do not include ghost cells

    amrex::MultiFab::Copy(*mf_z, *mf_x, 0, 0, ncomp, nghost);
    mf_z->plus(b, nghost);
}